

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

ValueType OpenMesh::IO::get_property_type(string *_string1,string *_string2)

{
  bool bVar1;
  ValueType VVar2;
  
  bVar1 = std::operator==(_string1,"float32");
  VVar2 = ValueTypeFLOAT32;
  if (!bVar1) {
    bVar1 = std::operator==(_string2,"float32");
    if (!bVar1) {
      bVar1 = std::operator==(_string1,"float64");
      VVar2 = ValueTypeFLOAT64;
      if (!bVar1) {
        bVar1 = std::operator==(_string2,"float64");
        if (!bVar1) {
          bVar1 = std::operator==(_string1,"float");
          VVar2 = ValueTypeFLOAT;
          if (!bVar1) {
            bVar1 = std::operator==(_string2,"float");
            if (!bVar1) {
              bVar1 = std::operator==(_string1,"double");
              VVar2 = ValueTypeDOUBLE;
              if (!bVar1) {
                bVar1 = std::operator==(_string2,"double");
                if (!bVar1) {
                  bVar1 = std::operator==(_string1,"int8");
                  VVar2 = ValueTypeINT8;
                  if (!bVar1) {
                    bVar1 = std::operator==(_string2,"int8");
                    if (!bVar1) {
                      bVar1 = std::operator==(_string1,"uint8");
                      VVar2 = ValueTypeUINT8;
                      if (!bVar1) {
                        bVar1 = std::operator==(_string2,"uint8");
                        if (!bVar1) {
                          bVar1 = std::operator==(_string1,"char");
                          VVar2 = ValueTypeCHAR;
                          if (!bVar1) {
                            bVar1 = std::operator==(_string2,"char");
                            if (!bVar1) {
                              bVar1 = std::operator==(_string1,"uchar");
                              VVar2 = ValueTypeUCHAR;
                              if (!bVar1) {
                                bVar1 = std::operator==(_string2,"uchar");
                                if (!bVar1) {
                                  bVar1 = std::operator==(_string1,"int32");
                                  VVar2 = ValueTypeINT32;
                                  if (!bVar1) {
                                    bVar1 = std::operator==(_string2,"int32");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(_string1,"uint32");
                                      VVar2 = ValueTypeUINT32;
                                      if (!bVar1) {
                                        bVar1 = std::operator==(_string2,"uint32");
                                        if (!bVar1) {
                                          bVar1 = std::operator==(_string1,"int");
                                          VVar2 = ValueTypeINT;
                                          if (!bVar1) {
                                            bVar1 = std::operator==(_string2,"int");
                                            if (!bVar1) {
                                              bVar1 = std::operator==(_string1,"uint");
                                              VVar2 = ValueTypeUINT;
                                              if (!bVar1) {
                                                bVar1 = std::operator==(_string2,"uint");
                                                if (!bVar1) {
                                                  bVar1 = std::operator==(_string1,"int16");
                                                  VVar2 = ValueTypeINT16;
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==(_string2,"int16");
                                                    if (!bVar1) {
                                                      bVar1 = std::operator==(_string1,"uint16");
                                                      VVar2 = ValueTypeUINT16;
                                                      if (!bVar1) {
                                                        bVar1 = std::operator==(_string2,"uint16");
                                                        if (!bVar1) {
                                                          bVar1 = std::operator==(_string1,"short");
                                                          VVar2 = ValueTypeSHORT;
                                                          if (!bVar1) {
                                                            bVar1 = std::operator==(_string2,"short"
                                                                                   );
                                                            if (!bVar1) {
                                                              bVar1 = std::operator==(_string1,
                                                  "ushort");
                                                  if (bVar1) {
                                                    VVar2 = ValueTypeUSHORT;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(_string2,"ushort");
                                                    VVar2 = (uint)bVar1 << 3;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar2;
}

Assistant:

_PLYReader_::ValueType get_property_type(std::string _string1, std::string _string2) {

    if (_string1 == "float32" || _string2 == "float32")

        return _PLYReader_::ValueTypeFLOAT32;

    else if (_string1 == "float64" || _string2 == "float64")

        return _PLYReader_::ValueTypeFLOAT64;

    else if (_string1 == "float" || _string2 == "float")

        return _PLYReader_::ValueTypeFLOAT;

    else if (_string1 == "double" || _string2 == "double")

        return _PLYReader_::ValueTypeDOUBLE;

    else if (_string1 == "int8" || _string2 == "int8")

        return _PLYReader_::ValueTypeINT8;

    else if (_string1 == "uint8" || _string2 == "uint8")

        return _PLYReader_::ValueTypeUINT8;

    else if (_string1 == "char" || _string2 == "char")

        return _PLYReader_::ValueTypeCHAR;

    else if (_string1 == "uchar" || _string2 == "uchar")

        return _PLYReader_::ValueTypeUCHAR;

    else if (_string1 == "int32" || _string2 == "int32")

        return _PLYReader_::ValueTypeINT32;

    else if (_string1 == "uint32" || _string2 == "uint32")

        return _PLYReader_::ValueTypeUINT32;

    else if (_string1 == "int" || _string2 == "int")

        return _PLYReader_::ValueTypeINT;

    else if (_string1 == "uint" || _string2 == "uint")

        return _PLYReader_::ValueTypeUINT;

    else if (_string1 == "int16" || _string2 == "int16")

        return _PLYReader_::ValueTypeINT16;

    else if (_string1 == "uint16" || _string2 == "uint16")

        return _PLYReader_::ValueTypeUINT16;

    else if (_string1 == "short" || _string2 == "short")

        return _PLYReader_::ValueTypeSHORT;

    else if (_string1 == "ushort" || _string2 == "ushort")

        return _PLYReader_::ValueTypeUSHORT;

    return _PLYReader_::Unsupported;
}